

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satsolver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  GetOpt_pp *pGVar2;
  ostream *poVar3;
  expression *a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  expression *local_310;
  expression *out_exp;
  expression *in_exp;
  string local_2f8 [32];
  _OptionT<int> local_2d8;
  allocator local_299;
  string local_298 [32];
  _OptionT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  allocator local_239;
  string local_238 [32];
  _OptionT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  allocator local_1d9;
  string local_1d8 [32];
  OptionPresent local_1b8;
  undefined4 local_180;
  allocator local_179;
  string local_178 [32];
  OptionPresent local_158;
  int local_120;
  bool local_11a;
  allocator local_119;
  int mode;
  bool terminal_flag;
  string output_file_string;
  allocator local_e1;
  string local_e0 [8];
  string input_file_string;
  undefined1 local_c0 [8];
  GetOpt_pp optparser;
  char **argv_local;
  int argc_local;
  
  optparser._tokens_deleter._first = (Token **)argv;
  GetOpt::GetOpt_pp::GetOpt_pp((GetOpt_pp *)local_c0,argc,argv);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"input.txt",&local_e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&mode,"output.txt",&local_119);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_120 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"help",&local_179);
  GetOpt::OptionPresent::OptionPresent(&local_158,'h',(string *)local_178);
  pGVar2 = GetOpt::GetOpt_pp::operator>>((GetOpt_pp *)local_c0,&local_158.super__Option);
  bVar1 = GetOpt::GetOpt_pp::operator_cast_to_bool(pGVar2);
  GetOpt::OptionPresent::~OptionPresent(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,(string *)help_string_abi_cxx11_);
    argv_local._4_4_ = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"terminal",&local_1d9);
    GetOpt::OptionPresent::OptionPresent(&local_1b8,'t',(string *)local_1d8,&local_11a);
    pGVar2 = GetOpt::GetOpt_pp::operator>>((GetOpt_pp *)local_c0,&local_1b8.super__Option);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"input",&local_239);
    GetOpt::Option<std::__cxx11::string>
              (&local_218,(GetOpt *)0x69,(char)local_238,(string *)local_e0,in_R8);
    pGVar2 = GetOpt::GetOpt_pp::operator>>(pGVar2,(_Option *)&local_218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"output",&local_299);
    GetOpt::Option<std::__cxx11::string>
              (&local_278,(GetOpt *)0x6f,(char)local_298,(string *)&mode,in_R8);
    pGVar2 = GetOpt::GetOpt_pp::operator>>(pGVar2,(_Option *)&local_278);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f8,"mode",(allocator *)((long)&in_exp + 7));
    GetOpt::Option<int>(&local_2d8,'m',(string *)local_2f8,&local_120);
    GetOpt::GetOpt_pp::operator>>(pGVar2,(_Option *)&local_2d8);
    GetOpt::_OptionT<int>::~_OptionT(&local_2d8);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&in_exp + 7));
    GetOpt::
    _OptionT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~_OptionT(&local_278);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    GetOpt::
    _OptionT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~_OptionT(&local_218);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    GetOpt::OptionPresent::~OptionPresent(&local_1b8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    poVar3 = std::operator<<((ostream *)&std::cout,"Terminal Mode: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(local_11a & 1));
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"Input File String: ");
    poVar3 = std::operator<<(poVar3,local_e0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"Output File String: ");
    poVar3 = std::operator<<(poVar3,(string *)&mode);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"Mode: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_120);
    std::operator<<(poVar3,"\n");
    std::istream::get();
    a = read_exp_from_file((string *)local_e0);
    local_310 = (expression *)0x0;
    if (a == (expression *)0x0) {
      std::operator<<((ostream *)&std::cout,"Had problems reading input expression!\n");
      argv_local._4_4_ = 1;
    }
    else {
      switch(local_120) {
      case 0:
        std::operator<<((ostream *)&std::cout,"Satisfyability Not Implemented\n");
        break;
      case 1:
        CNF_FORM(a);
        local_310 = a;
        break;
      case 2:
        DNF_FORM(a);
        local_310 = a;
        break;
      case 3:
        reduce_associative(a);
        local_310 = a;
        break;
      case 4:
        local_310 = a;
        break;
      case 5:
        negated_standard(a);
        local_310 = a;
        break;
      case 6:
        dual_standard(a);
        local_310 = a;
        break;
      case 7:
        standard_form_raw(a);
        local_310 = a;
        break;
      case 8:
        standard_form(a);
        local_310 = a;
        break;
      case 9:
        std::operator<<((ostream *)&std::cout,"NANDIFY Not Implemented\n");
        break;
      case 10:
        std::operator<<((ostream *)&std::cout,"NORIFY Not Implemented\n");
        break;
      default:
        std::operator<<((ostream *)&std::cout,
                        "Invalid Mode! Use -h or --help for more information!\n");
        argv_local._4_4_ = 1;
        goto LAB_00105426;
      }
      if (local_310 == (expression *)0x0) {
        std::operator<<((ostream *)&std::cout,"Had problems creating output expression!\n");
        argv_local._4_4_ = 1;
      }
      else {
        write_exp_to_file(local_310,(string *)&mode,(bool)(local_11a & 1));
        std::istream::get();
        argv_local._4_4_ = 0;
      }
    }
  }
LAB_00105426:
  local_180 = 1;
  std::__cxx11::string::~string((string *)&mode);
  std::__cxx11::string::~string(local_e0);
  GetOpt::GetOpt_pp::~GetOpt_pp((GetOpt_pp *)local_c0);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]){

	GetOpt::GetOpt_pp optparser(argc, argv);
	std::string input_file_string = "input.txt",
		output_file_string = "output.txt";
	bool terminal_flag;
	int mode = 0;

	// If the help flag is set, then we don't actually do any work!
	if (optparser >> GetOpt::OptionPresent('h', "help")) {
		std::cout << help_string;
		return 0;
	}

	// Not providing the option should leave input file strings alone
	// Gonna do some testing now
	optparser >> GetOpt::OptionPresent('t', "terminal", terminal_flag)
		>> GetOpt::Option('i', "input", input_file_string)
		>> GetOpt::Option('o', "output", output_file_string)
		>> GetOpt::Option('m', "mode", mode);

#ifdef DEBUG_INPUT_PARSE
	std::cout << "Terminal Mode: " << terminal_flag << "\n"
		<< "Input File String: " << input_file_string << "\n"
		<< "Output File String: " << output_file_string << "\n"
		<< "Mode: " << mode << "\n";
	std::cin.get();
#endif // DEBUG_INPUT_PARSE

	// Read in from the input file
	expression* in_exp = read_exp_from_file(input_file_string);
	expression* out_exp = NULL;
	
	if (in_exp == NULL) {
		std::cout << "Had problems reading input expression!\n";
		return 1;
	}

	/*
		Convert the input expression into an output expression,
		These are all implemented in satform
	*/
	switch (mode) {
	case 0:
		std::cout << "Satisfyability Not Implemented\n";
		break;
	case 1:
		CNF_FORM(in_exp);
		out_exp = in_exp;
		break;
	case 2:
		DNF_FORM(in_exp);
		out_exp = in_exp;
		break;
	case 3:
		reduce_associative(in_exp);
		out_exp = in_exp;
		break;
	case 4:
		out_exp = in_exp;
		break;
	case 5:
		negated_standard(in_exp);
		out_exp = in_exp;
		break;
	case 6:
		dual_standard(in_exp);
		out_exp = in_exp;
		break;
	case 7:
		standard_form_raw(in_exp);
		out_exp = in_exp;
		break;
	case 8:
		standard_form(in_exp);
		out_exp = in_exp;
		break;
	case 9:
		std::cout << "NANDIFY Not Implemented\n";
		break;
	case 10:
		std::cout << "NORIFY Not Implemented\n"; 
		break;
	default:
		std::cout << "Invalid Mode! Use -h or --help for more information!\n";
		return 1;
	}

	if (out_exp == NULL) {
		std::cout << "Had problems creating output expression!\n";
		return 1;
	}

	write_exp_to_file(out_exp, output_file_string, terminal_flag);

	std::cin.get();
	return 0;
}